

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::BasicReporter::ReportCounts
          (BasicReporter *this,string *label,Counts *counts,string *allPrefix)

{
  pointer pcVar1;
  ostream *poVar2;
  char *local_68;
  long local_60;
  char local_58 [16];
  undefined1 local_48 [8];
  _Alloc_hider local_40;
  char local_30 [16];
  
  poVar2 = (this->m_config).m_stream;
  if (counts->passed != 0) {
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," of ",4);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(label->_M_dataplus)._M_p,label->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"s failed",8);
    return;
  }
  local_68 = local_58;
  if (counts->failed < 2) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"");
  }
  else {
    pcVar1 = (allPrefix->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,pcVar1,pcVar1 + allPrefix->_M_string_length);
  }
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_68,local_60);
  local_48 = (undefined1  [8])counts->failed;
  pcVar1 = (label->_M_dataplus)._M_p;
  local_40._M_p = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + label->_M_string_length);
  poVar2 = operator<<(poVar2,(pluralise *)local_48);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," failed",7);
  if (local_40._M_p != local_30) {
    operator_delete(local_40._M_p);
  }
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  return;
}

Assistant:

void ReportCounts( const std::string& label, const Counts& counts, const std::string& allPrefix = "All " ) {
            if( counts.passed )
                m_config.stream() << counts.failed << " of " << counts.total() << " " << label << "s failed";
            else
                m_config.stream() << ( counts.failed > 1 ? allPrefix : "" ) << pluralise( counts.failed, label ) << " failed";
        }